

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O3

void __thiscall json_deserializer::json_reader::json_reader(json_reader *this,string *value)

{
  string local_38;
  
  this->index = 0;
  (this->cbuf)._M_dataplus._M_p = (pointer)&(this->cbuf).field_2;
  (this->cbuf)._M_string_length = 0;
  (this->cbuf).field_2._M_local_buf[0] = '\0';
  trim(&local_38,value);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->cbuf,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

explicit json_reader(const string& value) {
            cbuf = trim(value);
        }